

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O3

oonf_rfc5444_protocol * oonf_rfc5444_add_protocol(char *name,_Bool fixed_local_port)

{
  long lVar1;
  oonf_rfc5444_protocol *poVar2;
  rfc5444_reader *prVar3;
  rfc5444_reader *prVar4;
  byte bVar5;
  
  bVar5 = 0;
  lVar1 = avl_find(&_protocol_tree,name);
  if (lVar1 == 0) {
    poVar2 = (oonf_rfc5444_protocol *)oonf_class_malloc(&_protocol_memcookie);
    if (poVar2 == (oonf_rfc5444_protocol *)0x0) {
      return (oonf_rfc5444_protocol *)0x0;
    }
    strscpy(poVar2,name,0x20);
    poVar2->fixed_local_port = fixed_local_port;
    (poVar2->_node).key = poVar2;
    avl_insert(&_protocol_tree,&poVar2->_node);
    prVar3 = &_reader_template;
    prVar4 = &poVar2->reader;
    for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
      (prVar4->packet_consumer).list_head.next = (prVar3->packet_consumer).list_head.next;
      prVar3 = (rfc5444_reader *)((long)prVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      prVar4 = (rfc5444_reader *)((long)prVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    memcpy(&poVar2->writer,&_writer_template,0x140);
    (poVar2->writer).msg_buffer = poVar2->_msg_buffer;
    (poVar2->writer).addrtlv_buffer = poVar2->_addrtlv_buffer;
    rfc5444_reader_init(&poVar2->reader);
    rfc5444_writer_init(&poVar2->writer);
    (poVar2->writer).message_generation_notifier = _cb_msggen_notifier;
    oonf_duplicate_set_add(&poVar2->forwarded_set,1);
    oonf_duplicate_set_add(&poVar2->processed_set,1);
    avl_init(&poVar2->_interface_tree,avl_comp_strcasecmp,0);
  }
  else {
    poVar2 = (oonf_rfc5444_protocol *)(lVar1 + -0x280);
  }
  if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(2,(ulong)_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x1d7,0,0,
             "Add protocol %s (refcount was %d)",name,poVar2->_refcount);
  }
  poVar2->_refcount = poVar2->_refcount + 1;
  return poVar2;
}

Assistant:

struct oonf_rfc5444_protocol *
oonf_rfc5444_add_protocol(const char *name, bool fixed_local_port) {
  struct oonf_rfc5444_protocol *protocol;

  protocol = avl_find_element(&_protocol_tree, name, protocol, _node);
  if (!protocol) {
    protocol = oonf_class_malloc(&_protocol_memcookie);
    if (protocol == NULL) {
      return NULL;
    }

    /* set name */
    strscpy(protocol->name, name, sizeof(protocol->name));
    protocol->fixed_local_port = fixed_local_port;

    /* hook into global protocol tree */
    protocol->_node.key = protocol->name;
    avl_insert(&_protocol_tree, &protocol->_node);

    /* initialize rfc5444 reader/writer */
    memcpy(&protocol->reader, &_reader_template, sizeof(_reader_template));
    memcpy(&protocol->writer, &_writer_template, sizeof(_writer_template));
    protocol->writer.msg_buffer = protocol->_msg_buffer;
    protocol->writer.addrtlv_buffer = protocol->_addrtlv_buffer;
    rfc5444_reader_init(&protocol->reader);
    rfc5444_writer_init(&protocol->writer);

    protocol->writer.message_generation_notifier = _cb_msggen_notifier;

    /* initialize processing and forwarding set */
    oonf_duplicate_set_add(&protocol->forwarded_set, OONF_DUPSET_16BIT);
    oonf_duplicate_set_add(&protocol->processed_set, OONF_DUPSET_16BIT);

    /* init interface subtree */
    avl_init(&protocol->_interface_tree, avl_comp_strcasecmp, false);
  }

  OONF_INFO(LOG_RFC5444, "Add protocol %s (refcount was %d)", name, protocol->_refcount);

  /* keep track of reference count */
  protocol->_refcount++;

  return protocol;
}